

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

PropertyQueryFlags __thiscall
Js::TypedArrayBase::GetPropertyQuery
          (TypedArrayBase *this,Var originalInstance,PropertyId propertyId,Var *value,
          PropertyValueInfo *info,ScriptContext *requestContext)

{
  Var aValue;
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  int iVar4;
  BOOL BVar5;
  PropertyRecord *this_00;
  undefined4 extraout_var;
  undefined4 *puVar6;
  JavascriptLibrary *this_01;
  RecyclableObject *pRVar7;
  PropertyRecord *propertyRecord;
  ScriptContext *requestContext_local;
  PropertyValueInfo *info_local;
  Var *value_local;
  PropertyId propertyId_local;
  Var originalInstance_local;
  TypedArrayBase *this_local;
  TypeId local_18;
  TypeId typeId;
  
  this_00 = ScriptContext::GetPropertyName(requestContext,propertyId);
  bVar2 = PropertyRecord::IsNumeric(this_00);
  if (bVar2) {
    uVar3 = PropertyRecord::GetNumericValue(this_00);
    iVar4 = (*(this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(this,(ulong)uVar3);
    *value = (Var)CONCAT44(extraout_var,iVar4);
    aValue = *value;
    if (aValue == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    bVar2 = TaggedInt::Is(aValue);
    if (bVar2) {
      local_18 = TypeIds_FirstNumberType;
    }
    else {
      bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(aValue);
      if (bVar2) {
        local_18 = TypeIds_Number;
      }
      else {
        pRVar7 = UnsafeVarTo<Js::RecyclableObject>(aValue);
        if (pRVar7 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        local_18 = RecyclableObject::GetTypeId(pRVar7);
        if ((0x57 < (int)local_18) && (BVar5 = RecyclableObject::IsExternal(pRVar7), BVar5 == 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
      }
    }
    if (local_18 == TypeIds_Undefined) {
      this_local._4_4_ = Property_NotFound;
    }
    else {
      this_local._4_4_ = Property_Found;
    }
  }
  else {
    bVar2 = PropertyRecord::IsSymbol(this_00);
    if ((bVar2) || (BVar5 = CanonicalNumericIndexString(propertyId,requestContext), BVar5 == 0)) {
      this_local._4_4_ =
           DynamicObject::GetPropertyQuery
                     ((DynamicObject *)this,originalInstance,propertyId,value,info,requestContext);
    }
    else {
      this_01 = ScriptContext::GetLibrary(requestContext);
      pRVar7 = JavascriptLibraryBase::GetUndefined(&this_01->super_JavascriptLibraryBase);
      *value = pRVar7;
      this_local._4_4_ = Property_NotFound_NoProto;
    }
  }
  return this_local._4_4_;
}

Assistant:

PropertyQueryFlags TypedArrayBase::GetPropertyQuery(Var originalInstance, PropertyId propertyId, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        const Js::PropertyRecord* propertyRecord = requestContext->GetPropertyName(propertyId);
        if (propertyRecord->IsNumeric())
        {
            *value = this->DirectGetItem(propertyRecord->GetNumericValue());
            if (JavascriptOperators::GetTypeId(*value) == Js::TypeIds_Undefined)
            {
                return PropertyQueryFlags::Property_NotFound;
            }
            return PropertyQueryFlags::Property_Found;
        }
        if (!propertyRecord->IsSymbol() && CanonicalNumericIndexString(propertyId, requestContext))
        {
            *value = requestContext->GetLibrary()->GetUndefined();
            return PropertyQueryFlags::Property_NotFound_NoProto;
        }

        return DynamicObject::GetPropertyQuery(originalInstance, propertyId, value, info, requestContext);
    }